

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_2::DeepTiledInputFile,Imf_3_2::DeepTiledOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  void *pvVar7;
  size_t sVar8;
  DeepTiledOutputFile file;
  MultiPartInputFile file_1;
  Header f;
  long *local_88;
  long lStack_80;
  long local_78 [2];
  MultiPartInputFile local_68 [16];
  TileDescription local_58 [3];
  
  local_88 = (long *)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_58,0x40,0x40,1.0,(Vec2 *)&local_88,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&local_88,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"Dummy");
  sVar8 = *(size_t *)(filename + 8);
  if ((sVar8 != DAT_001efe90) ||
     ((sVar8 != 0 &&
      (iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8), iVar2 != 0))
     )) {
    Imf_3_2::Header::setType((string *)local_58);
  }
  puVar4 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar4 = 2;
  local_88 = (long *)0x2000000020;
  lStack_80 = 0;
  Imf_3_2::Header::setTileDescription(local_58);
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile
            ((DeepTiledOutputFile *)&local_88,"/var/tmp/badfile.exr",(Header *)local_58,iVar2);
  Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile((DeepTiledOutputFile *)&local_88);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_68,"/var/tmp/badfile.exr",iVar2,true);
  sVar8 = DAT_001efe68;
  if (DAT_001efe68 == DAT_001efe90) {
    if (DAT_001efe68 == 0) {
LAB_0012f4b1:
      sVar8 = 0;
    }
    else {
      iVar2 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001efe68);
      if (iVar2 != 0) goto LAB_0012f39e;
    }
  }
  else {
LAB_0012f39e:
    Imf_3_2::MultiPartInputFile::header((int)local_68);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 == DAT_001efe68) {
      if (sVar8 == 0) goto LAB_0012f4b1;
      iVar2 = bcmp((void *)*puVar5,Imf_3_2::DEEPTILE_abi_cxx11_,sVar8);
      if (iVar2 == 0) goto LAB_0012f530;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,Imf_3_2::DEEPTILE_abi_cxx11_,DAT_001efe68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
    Imf_3_2::MultiPartInputFile::header((int)local_68);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from multipart when input type was ",0x24);
    sVar8 = *(size_t *)(filename + 8);
    if (sVar8 == DAT_001efe90) {
      if (sVar8 != 0) {
        pvVar7 = *(void **)filename;
        iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
        if (iVar2 != 0) goto LAB_0012f4b9;
      }
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
    }
    else {
      pvVar7 = *(void **)filename;
LAB_0012f4b9:
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,pvVar7,sVar8 + (long)pvVar7);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_88,lStack_80);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    sVar8 = DAT_001efe68;
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
      sVar8 = DAT_001efe68;
    }
  }
LAB_0012f530:
  if ((sVar8 != DAT_001efe90) ||
     ((sVar8 != 0 &&
      (iVar2 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8),
      iVar2 != 0)))) {
    Imf_3_2::MultiPartInputFile::header((int)local_68);
    puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if ((sVar8 != DAT_001efe68) ||
       ((sVar8 != 0 &&
        (iVar2 = bcmp((void *)*puVar5,Imf_3_2::DEEPTILE_abi_cxx11_,sVar8), iVar2 != 0)))) {
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
  }
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_68);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)local_68,"/var/tmp/badfile.exr",iVar2);
  if ((DAT_001efe68 == DAT_001efe90) &&
     ((DAT_001efe68 == 0 ||
      (iVar2 = bcmp(Imf_3_2::DEEPTILE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                    DAT_001efe68), iVar2 == 0)))) {
    Imf_3_2::DeepTiledInputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_2::DeepTiledInputFile::header();
    cVar1 = Imf_3_2::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_2::DeepTiledInputFile, OUT = Imf_3_2::DeepTiledOutputFile]"
                   );
    }
    goto LAB_0012f7e0;
  }
  Imf_3_2::DeepTiledInputFile::header();
  puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  sVar8 = puVar5[1];
  if ((sVar8 == DAT_001efe68) &&
     ((sVar8 == 0 || (iVar2 = bcmp((void *)*puVar5,Imf_3_2::DEEPTILE_abi_cxx11_,sVar8), iVar2 == 0))
     )) goto LAB_0012f7e0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_2::DEEPTILE_abi_cxx11_,DAT_001efe68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
  Imf_3_2::DeepTiledInputFile::header();
  puVar5 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," when input type was ",0x15);
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001efe90) {
    if (sVar8 != 0) {
      pvVar7 = *(void **)filename;
      iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0012f770;
    }
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unset","");
  }
  else {
    pvVar7 = *(void **)filename;
LAB_0012f770:
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,pvVar7,sVar8 + (long)pvVar7);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_88,lStack_80);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
LAB_0012f7e0:
  Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)local_68);
  remove("/var/tmp/badfile.exr");
  Imf_3_2::Header::~Header((Header *)local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}